

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O3

bool __thiscall Field::valuePossible(Field *this,int i)

{
  reference rVar1;
  
  if (this->fixed_ == true) {
    return this->value_ == i;
  }
  if ((int)((*(int *)&(this->valuesPossible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            *(int *)&(this->valuesPossible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
           (this->valuesPossible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset) < i) {
    return false;
  }
  rVar1 = std::vector<bool,_std::allocator<bool>_>::at(&this->valuesPossible_,(long)(i + -1));
  return (*rVar1._M_p & rVar1._M_mask) != 0;
}

Assistant:

bool Field::valuePossible(int i)
{
  if(fixed_)
  {
    return value_ == i;
  }
  int l = valuesPossible_.size();
  if(l < i)
    return false;
  return valuesPossible_.at(i-1);
}